

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  string field_name;
  string local_d0;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  string local_90;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"[","");
  bVar4 = TryConsume(this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    bVar4 = ConsumeFullTypeName(this,&local_70);
    if (bVar4) {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"]","");
      bVar4 = Consume(this,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) goto LAB_0033a232;
    }
  }
  else {
    bVar4 = ConsumeIdentifier(this,&local_70);
    if (bVar4) {
LAB_0033a232:
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,":","");
      bVar4 = TryConsume(this,&local_d0);
      if (bVar4) {
        local_b0 = local_a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"{","");
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        if ((sVar2 == local_a8) &&
           ((sVar2 == 0 ||
            (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_b0,sVar2),
            iVar5 == 0)))) goto LAB_0033a302;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"<","");
        sVar2 = (this->tokenizer_).current_.text._M_string_length;
        bVar3 = true;
        if (sVar2 == local_48) {
          bVar6 = true;
          if (sVar2 != 0) {
            iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_50,sVar2);
            bVar6 = iVar5 != 0;
            goto LAB_0033a308;
          }
          goto LAB_0033a305;
        }
        bVar6 = true;
      }
      else {
LAB_0033a302:
        bVar6 = false;
LAB_0033a305:
        bVar3 = bVar6;
        bVar6 = false;
      }
LAB_0033a308:
      if ((bVar3) && (local_50 != local_40)) {
        operator_delete(local_50,local_40[0] + 1);
      }
      if ((bVar4) && (local_b0 != local_a0)) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        bVar4 = SkipFieldValue(this);
      }
      else {
        bVar4 = SkipFieldMessage(this);
      }
      if (bVar4 != false) {
        local_d0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,";","");
        bVar4 = TryConsume(this,&local_d0);
        if (!bVar4) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,",","");
          TryConsume(this,&local_90);
          if ((!bVar4) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2)) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        goto LAB_0033a41a;
      }
    }
  }
  bVar4 = false;
LAB_0033a41a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool SkipField() {
    string field_name;
    if (TryConsume("[")) {
      // Extension name.
      DO(ConsumeFullTypeName(&field_name));
      DO(Consume("]"));
    } else {
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }